

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibEval(Dar_Man_t *p,Aig_Obj_t *pRoot,Dar_Cut_t *pCut,int Required,int *pnMffcSize)

{
  int iVar1;
  uint Class_00;
  int iVar2;
  abctime aVar3;
  Dar_LibObj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  abctime aVar5;
  float *local_a8;
  float *local_88;
  abctime clk;
  int nNodesGained;
  int nNodesAdded;
  int nNodesSaved;
  int Class;
  int k;
  int Out;
  Dar_LibObj_t *pObj;
  float local_38;
  float PowerAdded;
  float PowerSaved;
  int fTraining;
  int *pnMffcSize_local;
  Dar_Cut_t *pDStack_20;
  int Required_local;
  Dar_Cut_t *pCut_local;
  Aig_Obj_t *pRoot_local;
  Dar_Man_t *p_local;
  
  PowerAdded = 0.0;
  _PowerSaved = pnMffcSize;
  pnMffcSize_local._4_4_ = Required;
  pDStack_20 = pCut;
  pCut_local = (Dar_Cut_t *)pRoot;
  pRoot_local = (Aig_Obj_t *)p;
  aVar3 = Abc_Clock();
  if ((*(uint *)&pDStack_20->field_0x4 >> 0x1d == 4) &&
     (iVar1 = Dar_LibCutMatch((Dar_Man_t *)pRoot_local,pDStack_20), iVar1 != 0)) {
    if (*(int *)((long)&((pRoot_local->field_0).pNext)->pFanin1 + 4) == 0) {
      local_88 = (float *)0x0;
    }
    else {
      local_88 = &local_38;
    }
    iVar1 = Dar_LibCutMarkMffc((Aig_Man_t *)pRoot_local->pFanin0,(Aig_Obj_t *)pCut_local,
                               *(uint *)&pDStack_20->field_0x4 >> 0x1d,local_88);
    Class_00 = (uint)s_DarLib->pMap[*(uint *)&pDStack_20->field_0x4 & 0xffff];
    Dar_LibEvalAssignNums((Dar_Man_t *)pRoot_local,Class_00,(Aig_Obj_t *)pCut_local);
    *(int *)((long)&pRoot_local[1].pFanin1 + 4) =
         s_DarLib->nSubgr0[(int)Class_00] + *(int *)((long)&pRoot_local[1].pFanin1 + 4);
    *(int *)(&pRoot_local[0x26].field_0x18 + (long)(int)Class_00 * 4) =
         s_DarLib->nSubgr0[(int)Class_00] +
         *(int *)(&pRoot_local[0x26].field_0x18 + (long)(int)Class_00 * 4);
    for (Class = 0; Class < s_DarLib->nSubgr0[(int)Class_00]; Class = Class + 1) {
      pObj_00 = Dar_LibObj(s_DarLib,s_DarLib->pSubgr0[(int)Class_00][Class]);
      pAVar4 = Aig_Regular(s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].field_0.pFunc);
      if (pAVar4 != (Aig_Obj_t *)pCut_local) {
        if (*(int *)((long)&((pRoot_local->field_0).pNext)->pFanin1 + 4) == 0) {
          local_a8 = (float *)0x0;
        }
        else {
          local_a8 = (float *)((long)&pObj + 4);
        }
        iVar2 = Dar_LibEval_rec(pObj_00,Class,
                                iVar1 - (uint)((*(int *)&((pRoot_local->field_0).pNext)->pFanin1 !=
                                                0 ^ 0xffU) & 1),pnMffcSize_local._4_4_,local_a8);
        iVar2 = iVar1 - iVar2;
        if ((*(int *)((long)&((pRoot_local->field_0).pNext)->pFanin1 + 4) == 0) ||
           (pObj._4_4_ <= local_38)) {
          if ((PowerAdded != 0.0) && (-1 < iVar2)) {
            Dar_LibIncrementScore(Class_00,Class,iVar2 + 1);
          }
          if (((-1 < iVar2) &&
              (((iVar2 != 0 || (*(int *)&((pRoot_local->field_0).pNext)->pFanin1 != 0)) &&
               (*(int *)&pRoot_local[1].pFanin0 <= iVar2)))) &&
             ((iVar2 != *(int *)&pRoot_local[1].pFanin0 ||
              (s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level <
               *(int *)((long)&pRoot_local[1].pFanin0 + 4))))) {
            Vec_PtrClear((Vec_Ptr_t *)(pRoot_local->field_5).pData);
            for (nNodesSaved = 0; nNodesSaved < (int)(*(uint *)&pDStack_20->field_0x4 >> 0x1d);
                nNodesSaved = nNodesSaved + 1) {
              Vec_PtrPush((Vec_Ptr_t *)(pRoot_local->field_5).pData,
                          s_DarLib->pDatas[nNodesSaved].field_0.pFunc);
            }
            pRoot_local[1].field_0.CioId = s_DarLib->pSubgr0[(int)Class_00][Class];
            *(int *)((long)&pRoot_local[1].field_0 + 4) = Class;
            *(int *)((long)&pRoot_local[1].pFanin0 + 4) =
                 s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level;
            *(int *)&pRoot_local[1].pFanin0 = iVar2;
            *(uint *)&pRoot_local[1].pFanin1 = Class_00;
            if (pnMffcSize_local._4_4_ < *(int *)((long)&pRoot_local[1].pFanin0 + 4)) {
              __assert_fail("p->LevelBest <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                            ,0x3c5,
                            "void Dar_LibEval(Dar_Man_t *, Aig_Obj_t *, Dar_Cut_t *, int, int *)");
            }
            *_PowerSaved = iVar1;
          }
        }
      }
    }
    aVar5 = Abc_Clock();
    *(int *)(&pRoot_local[1].field_0x18 + (long)(int)Class_00 * 4) =
         *(int *)(&pRoot_local[1].field_0x18 + (long)(int)Class_00 * 4) + (int)(aVar5 - aVar3);
    pRoot_local[0x3a].field_0.pNext =
         (Aig_Obj_t *)((aVar5 - aVar3) + (long)pRoot_local[0x3a].field_0.pNext);
  }
  return;
}

Assistant:

void Dar_LibEval( Dar_Man_t * p, Aig_Obj_t * pRoot, Dar_Cut_t * pCut, int Required, int * pnMffcSize )
{
    int fTraining = 0;
    float PowerSaved, PowerAdded;
    Dar_LibObj_t * pObj;
    int Out, k, Class, nNodesSaved, nNodesAdded, nNodesGained;
    abctime clk = Abc_Clock();
    if ( pCut->nLeaves != 4 )
        return;
    // check if the cut exits and assigns leaves and their levels
    if ( !Dar_LibCutMatch(p, pCut) )
        return;
    // mark MFFC of the node
    nNodesSaved = Dar_LibCutMarkMffc( p->pAig, pRoot, pCut->nLeaves, p->pPars->fPower? &PowerSaved : NULL );
    // evaluate the cut
    Class = s_DarLib->pMap[pCut->uTruth];
    Dar_LibEvalAssignNums( p, Class, pRoot );
    // profile outputs by their savings
    p->nTotalSubgs += s_DarLib->nSubgr0[Class];
    p->ClassSubgs[Class] += s_DarLib->nSubgr0[Class];
    for ( Out = 0; Out < s_DarLib->nSubgr0[Class]; Out++ )
    {
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pSubgr0[Class][Out]);
        if ( Aig_Regular(s_DarLib->pDatas[pObj->Num].pFunc) == pRoot )
            continue;
        nNodesAdded = Dar_LibEval_rec( pObj, Out, nNodesSaved - !p->pPars->fUseZeros, Required, p->pPars->fPower? &PowerAdded : NULL );
        nNodesGained = nNodesSaved - nNodesAdded;
        if ( p->pPars->fPower && PowerSaved < PowerAdded )
            continue;
        if ( fTraining && nNodesGained >= 0 )
            Dar_LibIncrementScore( Class, Out, nNodesGained + 1 );
        if ( nNodesGained < 0 || (nNodesGained == 0 && !p->pPars->fUseZeros) )
            continue;
        if ( nNodesGained <  p->GainBest || 
            (nNodesGained == p->GainBest && s_DarLib->pDatas[pObj->Num].Level >= p->LevelBest) )
            continue;
        // remember this possibility
        Vec_PtrClear( p->vLeavesBest );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_PtrPush( p->vLeavesBest, s_DarLib->pDatas[k].pFunc );
        p->OutBest    = s_DarLib->pSubgr0[Class][Out];
        p->OutNumBest = Out;
        p->LevelBest  = s_DarLib->pDatas[pObj->Num].Level;
        p->GainBest   = nNodesGained;
        p->ClassBest  = Class;
        assert( p->LevelBest <= Required );
        *pnMffcSize   = nNodesSaved;
    }
clk = Abc_Clock() - clk;
p->ClassTimes[Class] += clk;
p->timeEval += clk;
}